

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.cc
# Opt level: O2

void brotli::StoreMetaBlockHeader
               (size_t len,bool is_uncompressed,size_t *storage_ix,uint8_t *storage)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined7 in_register_00000031;
  
  uVar2 = *storage_ix;
  *(ulong *)(storage + (uVar2 >> 3)) = (ulong)storage[uVar2 >> 3];
  uVar1 = uVar2 + 1;
  *storage_ix = uVar1;
  uVar3 = 0;
  if (0x10000 < len) {
    uVar3 = 1L << ((byte)uVar1 & 7);
  }
  *(ulong *)(storage + (uVar1 >> 3)) = uVar3 | storage[uVar1 >> 3];
  *storage_ix = uVar2 + 3;
  WriteBits((ulong)(0x10000 < len) * 4 + 0x10,len - 1,storage_ix,storage);
  WriteBits(1,CONCAT71(in_register_00000031,is_uncompressed) & 0xffffffff,storage_ix,storage);
  return;
}

Assistant:

static void StoreMetaBlockHeader(
    size_t len, bool is_uncompressed, size_t* storage_ix, uint8_t* storage) {
  // ISLAST
  WriteBits(1, 0, storage_ix, storage);
  if (len <= (1U << 16)) {
    // MNIBBLES is 4
    WriteBits(2, 0, storage_ix, storage);
    WriteBits(16, len - 1, storage_ix, storage);
  } else {
    // MNIBBLES is 5
    WriteBits(2, 1, storage_ix, storage);
    WriteBits(20, len - 1, storage_ix, storage);
  }
  // ISUNCOMPRESSED
  WriteBits(1, is_uncompressed, storage_ix, storage);
}